

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

X509_OBJECT * X509_OBJECT_retrieve_match(stack_st_X509_OBJECT *h,X509_OBJECT *x)

{
  int iVar1;
  X509_OBJECT *pXVar2;
  X509_OBJECT *a;
  X509_OBJECT *obj;
  size_t i;
  size_t idx;
  X509_OBJECT *x_local;
  stack_st_X509_OBJECT *h_local;
  
  idx = (size_t)x;
  x_local = (X509_OBJECT *)h;
  sk_X509_OBJECT_sort((stack_st_X509_OBJECT *)h);
  iVar1 = sk_X509_OBJECT_find((stack_st_X509_OBJECT *)x_local,&i,(X509_OBJECT *)idx);
  if (iVar1 == 0) {
    h_local = (stack_st_X509_OBJECT *)0x0;
  }
  else if ((*(int *)idx == 1) || (*(int *)idx == 2)) {
    for (obj = (X509_OBJECT *)i;
        pXVar2 = (X509_OBJECT *)sk_X509_OBJECT_num((stack_st_X509_OBJECT *)x_local), obj < pXVar2;
        obj = (X509_OBJECT *)((long)&obj->type + 1)) {
      a = (X509_OBJECT *)sk_X509_OBJECT_value((stack_st_X509_OBJECT *)x_local,(size_t)obj);
      iVar1 = x509_object_cmp((X509_OBJECT *)a,(X509_OBJECT *)idx);
      if (iVar1 != 0) {
        return (X509_OBJECT *)0x0;
      }
      if (*(int *)idx == 1) {
        iVar1 = X509_cmp((a->data).x509,*(X509 **)(idx + 8));
      }
      else {
        if (*(int *)idx != 2) {
          return a;
        }
        iVar1 = X509_CRL_match((X509_CRL *)(a->data).crl,*(X509_CRL **)(idx + 8));
      }
      if (iVar1 == 0) {
        return a;
      }
    }
    h_local = (stack_st_X509_OBJECT *)0x0;
  }
  else {
    h_local = (stack_st_X509_OBJECT *)sk_X509_OBJECT_value((stack_st_X509_OBJECT *)x_local,i);
  }
  return (X509_OBJECT *)h_local;
}

Assistant:

static X509_OBJECT *X509_OBJECT_retrieve_match(STACK_OF(X509_OBJECT) *h,
                                               X509_OBJECT *x) {
  sk_X509_OBJECT_sort(h);
  size_t idx;
  if (!sk_X509_OBJECT_find(h, &idx, x)) {
    return NULL;
  }
  if ((x->type != X509_LU_X509) && (x->type != X509_LU_CRL)) {
    return sk_X509_OBJECT_value(h, idx);
  }
  for (size_t i = idx; i < sk_X509_OBJECT_num(h); i++) {
    X509_OBJECT *obj = sk_X509_OBJECT_value(h, i);
    if (x509_object_cmp(obj, x)) {
      return NULL;
    }
    if (x->type == X509_LU_X509) {
      if (!X509_cmp(obj->data.x509, x->data.x509)) {
        return obj;
      }
    } else if (x->type == X509_LU_CRL) {
      if (!X509_CRL_match(obj->data.crl, x->data.crl)) {
        return obj;
      }
    } else {
      return obj;
    }
  }
  return NULL;
}